

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *node;
  ProceduralAssignStatementSyntax *pPVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  Token *in_stack_00000010;
  BumpAllocator *in_stack_00000048;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000050;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  NamedLabelSyntax *in_stack_ffffffffffffffa0;
  NamedLabelSyntax *local_50;
  
  if (*(long *)(__fn + 0x18) == 0) {
    local_50 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_50 = deepClone<slang::syntax::NamedLabelSyntax>
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  node = deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000050,in_stack_00000048);
  TVar2 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x8202be);
  deepClone<slang::syntax::ExpressionSyntax>((ExpressionSyntax *)node,in_stack_ffffffffffffff98);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ProceduralAssignStatementSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
                     (unaff_retaddr,(SyntaxKind *)__fn,(NamedLabelSyntax **)__child_stack,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_50,
                      (Token *)TVar2.info,TVar2._0_8_,in_stack_00000010);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ProceduralAssignStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ProceduralAssignStatementSyntax>(
        node.kind,
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.semi.deepClone(alloc)
    );
}